

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall ForStatement::print(ForStatement *this)

{
  ostream *this_00;
  ForStatement *this_local;
  
  std::operator<<((ostream *)&std::cout,"for ");
  (**this->_id->_vptr_ExprNode)();
  std::operator<<((ostream *)&std::cout," in range(");
  Testlist::print(this->_testlist);
  this_00 = std::operator<<((ostream *)&std::cout,") :");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"     ");
  Statements::print(this->_stmts);
  std::operator<<((ostream *)&std::cout,"");
  return;
}

Assistant:

void ForStatement::print() {

    std::cout << "for ";
    _id->print();
    std::cout << " in range(";
    _testlist->print();
    std::cout << ") :" << std::endl;
    std::cout << "     ";
    _stmts->print();
    std::cout << "";

}